

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocketPrivate::_q_connectedSlot(QSslSocketPrivate *this)

{
  long lVar1;
  undefined4 uVar2;
  QAbstractSocket *this_00;
  qintptr qVar3;
  QSslSocketPrivate *in_RDI;
  long in_FS_OFFSET;
  QSslSocket *q;
  undefined6 in_stack_ffffffffffffff88;
  quint16 in_stack_ffffffffffffff8e;
  QAbstractSocket *this_01;
  QAbstractSocket *this_02;
  QAbstractSocket *this_03;
  QAbstractSocket *this_04;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAbstractSocket *)q_func(in_RDI);
  this_01 = this_00;
  QAbstractSocket::localPort(this_00);
  QAbstractSocket::setLocalPort(this_01,in_stack_ffffffffffffff8e);
  this_02 = this_00;
  QAbstractSocket::localAddress(this_00);
  QAbstractSocket::setLocalAddress
            (this_01,(QHostAddress *)CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88));
  QHostAddress::~QHostAddress((QHostAddress *)0x3a6533);
  this_03 = this_00;
  QAbstractSocket::peerPort(this_01);
  QAbstractSocket::setPeerPort(this_01,in_stack_ffffffffffffff8e);
  this_04 = this_00;
  QAbstractSocket::peerAddress(this_02);
  QAbstractSocket::setPeerAddress
            (this_01,(QHostAddress *)CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88));
  QHostAddress::~QHostAddress((QHostAddress *)0x3a6594);
  QAbstractSocket::peerName(this_04);
  QAbstractSocket::setPeerName
            (this_01,(QString *)CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88));
  QString::~QString((QString *)0x3a65cd);
  qVar3 = (**(code **)(*(long *)&in_RDI->plainSocket->super_QAbstractSocket + 0x110))();
  (in_RDI->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.cachedSocketDescriptor = qVar3;
  uVar2 = QIODevice::readChannelCount();
  *(undefined4 *)&(in_RDI->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xa8 = uVar2;
  uVar2 = QIODevice::writeChannelCount();
  *(undefined4 *)&(in_RDI->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xac = uVar2;
  if ((in_RDI->autoStartHandshake & 1U) != 0) {
    QSslSocket::startClientEncryption((QSslSocket *)this_03);
  }
  QAbstractSocket::connected((QAbstractSocket *)0x3a6640);
  if ((((in_RDI->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.pendingClose & 1U) != 0) &&
     ((in_RDI->autoStartHandshake & 1U) == 0)) {
    (in_RDI->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.pendingClose = false;
    (**(code **)(*(long *)this_00 + 0x100))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::_q_connectedSlot()
{
    Q_Q(QSslSocket);
    q->setLocalPort(plainSocket->localPort());
    q->setLocalAddress(plainSocket->localAddress());
    q->setPeerPort(plainSocket->peerPort());
    q->setPeerAddress(plainSocket->peerAddress());
    q->setPeerName(plainSocket->peerName());
    cachedSocketDescriptor = plainSocket->socketDescriptor();
    readChannelCount = plainSocket->readChannelCount();
    writeChannelCount = plainSocket->writeChannelCount();

#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::_q_connectedSlot()";
    qCDebug(lcSsl) << "\tstate =" << q->state();
    qCDebug(lcSsl) << "\tpeer =" << q->peerName() << q->peerAddress() << q->peerPort();
    qCDebug(lcSsl) << "\tlocal =" << QHostInfo::fromName(q->localAddress().toString()).hostName()
             << q->localAddress() << q->localPort();
#endif

    if (autoStartHandshake)
        q->startClientEncryption();

    emit q->connected();

    if (pendingClose && !autoStartHandshake) {
        pendingClose = false;
        q->disconnectFromHost();
    }
}